

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_array.cpp
# Opt level: O1

void __thiscall VertexArray::VertexArray(VertexArray *this)

{
  (this->m_indexBuffer).super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_indexBuffer).super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->m_vertexBuffers).
           super__Vector_base<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_vertexBuffers).
           super__Vector_base<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)&this->binding_index = 0;
  *(undefined8 *)
   ((long)&(this->m_vertexBuffers).
           super__Vector_base<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (*glad_glGenVertexArrays)(1,&this->m_id);
  (*glad_glBindVertexArray)(this->m_id);
  return;
}

Assistant:

VertexArray::VertexArray()
  : m_indexBuffer(nullptr)
{
#if OPENGL_VERSION >= 45
    glCreateVertexArrays(1, &m_id);
#else
    glGenVertexArrays(1, &m_id);
    bind();
#endif

    DERR("VAO default CONSTR: " << m_id);
}